

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O2

void __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::
PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
::Put(PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
      *this,char c)

{
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,'%');
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
            (this->os_,"0123456789ABCDEF"[(byte)c >> 4]);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
            (this->os_,"0123456789ABCDEF"[(byte)c & 0xf]);
  return;
}

Assistant:

void Put(char c) { // UTF-8 must be byte
            unsigned char u = static_cast<unsigned char>(c);
            static const char hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
            os_.Put('%');
            os_.Put(static_cast<typename OutputStream::Ch>(hexDigits[u >> 4]));
            os_.Put(static_cast<typename OutputStream::Ch>(hexDigits[u & 15]));
        }